

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void opj_set_default_event_handler(opj_event_mgr_t *p_manager)

{
  opj_event_mgr_t *p_manager_local;
  
  p_manager->m_error_data = (void *)0x0;
  p_manager->m_warning_data = (void *)0x0;
  p_manager->m_info_data = (void *)0x0;
  p_manager->error_handler = opj_default_callback;
  p_manager->info_handler = opj_default_callback;
  p_manager->warning_handler = opj_default_callback;
  return;
}

Assistant:

void opj_set_default_event_handler(opj_event_mgr_t * p_manager)
{
    p_manager->m_error_data = 00;
    p_manager->m_warning_data = 00;
    p_manager->m_info_data = 00;
    p_manager->error_handler = opj_default_callback;
    p_manager->info_handler = opj_default_callback;
    p_manager->warning_handler = opj_default_callback;
}